

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRingBuffer.hpp
# Opt level: O0

void __thiscall de::RingBuffer<unsigned_char>::resize(RingBuffer<unsigned_char> *this,int newSize)

{
  uchar *puVar1;
  deBool dVar2;
  uchar *_tmp_;
  uchar *puStack_20;
  int ndx;
  uchar *buf;
  int newSize_local;
  RingBuffer<unsigned_char> *this_local;
  
  puStack_20 = (uchar *)operator_new__((long)newSize);
  for (_tmp_._4_4_ = 0; _tmp_._4_4_ < this->m_numElements; _tmp_._4_4_ = _tmp_._4_4_ + 1) {
    puStack_20[_tmp_._4_4_] = this->m_buffer[(this->m_back + _tmp_._4_4_) % this->m_size];
  }
  this->m_front = this->m_numElements;
  this->m_back = 0;
  this->m_size = newSize;
  do {
    puVar1 = this->m_buffer;
    this->m_buffer = puStack_20;
    dVar2 = deGetFalse();
    puStack_20 = puVar1;
  } while (dVar2 != 0);
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  return;
}

Assistant:

void RingBuffer<T>::resize (int newSize)
{
	DE_ASSERT(newSize >= m_numElements);
	T* buf = new T[newSize];

	try
	{
		// Copy old elements.
		for (int ndx = 0; ndx < m_numElements; ndx++)
			buf[ndx] = m_buffer[(m_back + ndx) % m_size];

		// Reset pointers.
		m_front		= m_numElements;
		m_back		= 0;
		m_size		= newSize;

		DE_SWAP(T*, buf, m_buffer);
		delete[] buf;
	}
	catch (...)
	{
		delete[] buf;
		throw;
	}
}